

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::RALocalAllocator::RALocalAllocator(RALocalAllocator *this,BaseRAPass *pass)

{
  long lVar1;
  RAAssignment *in_RSI;
  long *in_RDI;
  
  *in_RDI = (long)in_RSI;
  in_RDI[1] = *(long *)&(in_RSI->_layout).physTotal;
  in_RDI[2] = (long)in_RSI[3]._physToWorkIds._data[0];
  in_RDI[3] = (long)in_RSI[3]._physToWorkIds._data[3];
  in_RDI[4] = *(long *)&in_RSI[4]._layout;
  memset(in_RDI + 5,0,0x10);
  memset(in_RDI + 7,0,0x10);
  RAAssignment::RAAssignment(in_RSI);
  RAAssignment::RAAssignment(in_RSI);
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  *(undefined4 *)(in_RDI + 0x1e) = 0;
  memset((void *)((long)in_RDI + 0xf4),0,4);
  in_RDI[0x1f] = 0;
  lVar1 = *(long *)&in_RSI[2]._layout.physTotal;
  in_RDI[7] = *(long *)(lVar1 + 0x310);
  in_RDI[8] = *(long *)(lVar1 + 0x318);
  return;
}

Assistant:

inline explicit RALocalAllocator(BaseRAPass* pass) noexcept
    : _pass(pass),
      _cc(pass->cc()),
      _archTraits(pass->_archTraits),
      _availableRegs(pass->_availableRegs) {
    _funcPreservedRegs.init(pass->func()->frame().preservedRegs());
  }